

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conditionally_enabled_mutex.hpp
# Opt level: O3

void __thiscall
boost::asio::detail::conditionally_enabled_mutex::conditionally_enabled_mutex
          (conditionally_enabled_mutex *this,bool enabled)

{
  int iVar1;
  undefined **local_60 [2];
  int local_50;
  error_category *local_48;
  _Alloc_hider local_40;
  size_type local_38;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_30;
  
  iVar1 = pthread_mutex_init((pthread_mutex_t *)&this->mutex_,(pthread_mutexattr_t *)0x0);
  local_48 = system::system_category();
  if (iVar1 == 0) {
    this->enabled_ = enabled;
    return;
  }
  std::runtime_error::runtime_error((runtime_error *)local_60,"mutex");
  local_60[0] = &PTR__system_error_00120cb0;
  local_40._M_p = (pointer)&local_30;
  local_38 = 0;
  local_30._M_local_buf[0] = '\0';
  local_50 = iVar1;
  throw_exception<boost::system::system_error>((system_error *)local_60);
}

Assistant:

explicit conditionally_enabled_mutex(bool enabled)
    : enabled_(enabled)
  {
  }